

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkGear.cpp
# Opt level: O2

void __thiscall chrono::ChLinkGear::UpdateTime(ChLinkGear *this,double mytime)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  ulong uVar15;
  undefined8 uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  undefined8 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  double dVar34;
  double dVar35;
  double dVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar60 [32];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar61 [64];
  double dVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  double dVar102;
  undefined1 local_528 [16];
  ChQuaternion<double> local_508;
  double local_4e8;
  double local_4e0;
  double local_4d8;
  double local_4d0;
  ChVector<double> v;
  undefined1 local_4a8 [16];
  double local_498;
  undefined1 local_458 [16];
  double dStack_448;
  double dStack_440;
  double dStack_438;
  double dStack_430;
  double dStack_428;
  double dStack_420;
  double local_418;
  ChMatrix33<double> mrotma;
  ChVector<double> result;
  ChVector<double> local_398;
  ChVector<double> local_378;
  double local_358;
  double local_350;
  double local_348;
  double local_340;
  double local_338;
  double local_330;
  double local_328;
  double local_320;
  double local_318;
  Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> local_310;
  undefined1 local_308 [64];
  Coordsys local_2c8;
  ChVector<double> vrota;
  undefined1 local_1e8 [16];
  double local_1d8;
  ChFrame<double> abs_shaft1;
  ChMatrix33<double> ma2;
  ChFrame<double> abs_shaft2;
  ChMatrix33<double> marot_beta;
  undefined1 auVar29 [16];
  undefined1 auVar33 [64];
  undefined1 extraout_var [56];
  
  ChLink::UpdateTime((ChLink *)this,mytime);
  vrota.m_data[2] = 0.0;
  local_2c8.pos.m_data[2] = 0.0;
  abs_shaft2._vptr_ChFrame = (_func_int **)&DAT_3ff0000000000000;
  local_2c8.pos.m_data[0] = 0.0;
  local_2c8.pos.m_data[1] = 0.0;
  local_2c8.rot.m_data[0] = 1.0;
  local_2c8.rot.m_data[3] = 0.0;
  dStack_448 = 0.0;
  abs_shaft2.coord.pos.m_data[2] = 0.0;
  vrota.m_data[0] = 0.0;
  vrota.m_data[1] = 0.0;
  local_2c8.rot.m_data[1] = 0.0;
  local_2c8.rot.m_data[2] = 0.0;
  local_458 = ZEXT816(0);
  abs_shaft2.coord.pos.m_data[0] = 0.0;
  abs_shaft2.coord.pos.m_data[1] = 0.0;
  ChFrame<double>::ChFrame
            (&abs_shaft1,(ChVector<double> *)local_458,(ChQuaternion<double> *)&abs_shaft2);
  auVar61 = _local_458;
  local_458._0_8_ = 0x3ff0000000000000;
  auVar31 = _local_458;
  _dStack_438 = auVar61._32_32_;
  _local_458 = auVar31._0_24_;
  dStack_440 = 0.0;
  mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = 0.0;
  _local_458 = (double  [3])ZEXT824(0x3ff0000000000000);
  mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] = 0.0;
  mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = 0.0;
  ChFrame<double>::ChFrame
            (&abs_shaft2,(ChVector<double> *)&mrotma,(ChQuaternion<double> *)local_458);
  ChFrame<double>::TransformLocalToParent
            ((ChFrame<double> *)(this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1,
             &this->local_shaft1,&abs_shaft1);
  ChFrame<double>::TransformLocalToParent
            ((ChFrame<double> *)(this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body2,
             &this->local_shaft2,&abs_shaft2);
  Get_shaft_pos1((ChVector<double> *)local_458,this);
  Get_shaft_pos2((ChVector<double> *)&mrotma,this);
  auVar23._8_8_ =
       mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
  auVar23._0_8_ =
       mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0];
  result.m_data._0_16_ = vsubpd_avx(local_458,auVar23);
  result.m_data[2] =
       dStack_448 -
       mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
  local_4d0 = ChVector<double>::Length(&result);
  auVar61 = _local_458;
  auVar37._0_8_ = -result.m_data[2];
  auVar37._8_8_ = 0x8000000000000000;
  local_458._8_8_ = -result.m_data[1];
  local_458._0_8_ = -result.m_data[0];
  dStack_448 = (double)vmovlpd_avx(auVar37);
  _dStack_440 = auVar61._24_40_;
  mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&abs_shaft1.Amatrix;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&mrotma,
                    (ChVector<double> *)local_458);
  local_378.m_data[2] = 0.0;
  Vnorm<double>((ChVector<double> *)local_458,&local_378);
  auVar61 = _local_458;
  mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&abs_shaft2.Amatrix;
  local_378.m_data[0] = (double)local_458._0_8_;
  local_378.m_data[1] = (double)local_458._8_8_;
  local_378.m_data[2] = dStack_448;
  auVar38._0_8_ = -result.m_data[2];
  auVar38._8_8_ = 0x8000000000000000;
  local_458._8_8_ = -result.m_data[1];
  local_458._0_8_ = -result.m_data[0];
  dStack_448 = (double)vmovlpd_avx(auVar38);
  _dStack_440 = auVar61._24_40_;
  chrono::operator*((Transpose<Eigen::Matrix<double,_3,_3,_1,_3,_3>_> *)&mrotma,
                    (ChVector<double> *)local_458);
  local_398.m_data[2] = 0.0;
  Vnorm<double>((ChVector<double> *)local_458,&local_398);
  local_398.m_data[0] = (double)local_458._0_8_;
  local_398.m_data[1] = (double)local_458._8_8_;
  local_398.m_data[2] = dStack_448;
  local_528._0_8_ = ChAtan2(local_378.m_data[0],local_378.m_data[1]);
  local_528._8_8_ = extraout_XMM0_Qb;
  auVar61._0_8_ = ChAtan2(local_398.m_data[0],local_398.m_data[1]);
  auVar61._8_56_ = extraout_var;
  auVar28._0_8_ = this->a1;
  auVar28._8_8_ = this->a2;
  auVar75._8_8_ = 0x401921fb54442d18;
  auVar75._0_8_ = 0x401921fb54442d18;
  auVar94._8_8_ = 0x7fffffffffffffff;
  auVar94._0_8_ = 0x7fffffffffffffff;
  auVar13 = vdivpd_avx(auVar28,auVar75);
  auVar14 = vunpcklpd_avx(local_528,auVar61._0_16_);
  auVar13 = vroundpd_avx(auVar13,9);
  auVar17 = vfmadd231pd_fma(auVar14,auVar75,auVar13);
  auVar18._8_8_ = 0xc01921fb54442d18;
  auVar18._0_8_ = 0xc01921fb54442d18;
  auVar27 = vaddpd_avx512vl(auVar17,auVar18);
  auVar76._0_8_ = auVar17._0_8_ + 6.283185307179586;
  auVar76._8_8_ = auVar17._8_8_ + 6.283185307179586;
  auVar13 = vsubpd_avx(auVar76,auVar28);
  auVar14 = vsubpd_avx(auVar17,auVar28);
  auVar28 = vandpd_avx(auVar13,auVar94);
  auVar13 = vandpd_avx(auVar14,auVar94);
  uVar15 = vcmppd_avx512vl(auVar28,auVar13,1);
  auVar28 = vblendmpd_avx512vl(auVar17,auVar76);
  bVar12 = (bool)((byte)(uVar15 & 3) & 1);
  auVar29._0_8_ = (ulong)bVar12 * auVar28._0_8_ | (ulong)!bVar12 * auVar13._0_8_;
  uVar15 = (uVar15 & 3) >> 1;
  auVar29._8_8_ = uVar15 * auVar28._8_8_ | (ulong)!SUB81(uVar15,0) * auVar13._8_8_;
  auVar28 = vsubpd_avx(auVar27,auVar29);
  auVar13 = vsubpd_avx(auVar17,auVar29);
  auVar28 = vandpd_avx(auVar28,auVar94);
  auVar13 = vandpd_avx(auVar13,auVar94);
  uVar15 = vcmppd_avx512vl(auVar28,auVar13,1);
  bVar12 = (bool)((byte)(uVar15 & 3) & 1);
  uVar15 = (uVar15 & 3) >> 1;
  this->a1 = (double)((ulong)bVar12 * auVar27._0_8_ | !bVar12 * auVar29._0_8_);
  this->a2 = (double)(uVar15 * auVar27._8_8_ | !SUB81(uVar15,0) * auVar29._8_8_);
  Vnorm<double>((ChVector<double> *)local_458,&result);
  auVar61 = _local_458;
  uVar16 = local_458._0_8_;
  dVar34 = dStack_448;
  local_528._8_8_ = 0;
  local_528._0_8_ = dStack_448;
  Get_shaft_dir1((ChVector<double> *)local_458,this);
  auVar18 = auVar61._0_16_;
  uVar25 = local_458._8_8_;
  auVar87._8_8_ = 0;
  auVar87._0_8_ = local_458._8_8_;
  dVar35 = dStack_448;
  auVar79._8_8_ = 0;
  auVar79._0_8_ = dStack_448;
  auVar28 = vshufpd_avx(auVar18,auVar18,1);
  local_308._0_16_ = local_458;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = (double)uVar25 * dVar34;
  auVar13 = vfmsub231sd_fma(auVar39,auVar28,auVar79);
  dVar62 = auVar28._0_8_;
  auVar80._8_8_ = 0;
  auVar80._0_8_ = dStack_448 * (double)uVar16;
  auVar14 = vfmsub231sd_fma(auVar80,local_528,local_458);
  auVar63._8_8_ = 0;
  auVar63._0_8_ = local_458._0_8_ * dVar62;
  auVar17 = vfmsub231sd_fma(auVar63,auVar18,auVar87);
  mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar13._0_8_;
  mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar14._0_8_;
  mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar17._0_8_;
  Vnorm<double>((ChVector<double> *)local_458,(ChVector<double> *)&mrotma);
  auVar95._8_8_ = 0;
  auVar95._0_8_ = uVar25;
  uVar26 = local_458._8_8_;
  dVar36 = dStack_448;
  auVar88._8_8_ = 0;
  auVar88._0_8_ = dStack_448;
  uVar25 = local_458._0_8_;
  auVar64._8_8_ = 0;
  auVar64._0_8_ = (double)uVar26 * dVar35;
  auVar13 = vfmsub213sd_fma(auVar95,auVar88,auVar64);
  mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar13._0_8_;
  auVar40._0_8_ = dStack_448 * local_308._0_8_;
  auVar40._8_8_ = (double)uVar25 * local_308._8_8_;
  auVar13 = vunpcklpd_avx(auVar79,local_308._0_16_);
  auVar13 = vfmsub213pd_fma(auVar13,local_458,auVar40);
  mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar13._0_8_;
  mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar13._8_8_;
  local_308 = ZEXT1664(local_458);
  Vnorm<double>((ChVector<double> *)local_458,(ChVector<double> *)&mrotma);
  auVar89._8_8_ = 0;
  auVar89._0_8_ = uVar26;
  local_4e8 = (double)local_458._8_8_;
  local_4e0 = dStack_448;
  local_4d8 = (double)local_458._0_8_;
  auVar81._8_8_ = 0;
  auVar81._0_8_ = dVar62 * dVar36;
  auVar13 = vfmsub231sd_fma(auVar81,auVar89,local_528);
  mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar13._0_8_;
  auVar98._8_8_ = 0;
  auVar98._0_8_ = dVar34 * local_308._0_8_;
  auVar13 = vfmsub231sd_fma(auVar98,auVar88,auVar18);
  auVar90._8_8_ = 0;
  auVar90._0_8_ = (double)uVar16 * (double)uVar26;
  auVar14 = vfmsub231sd_fma(auVar90,local_308._0_16_,auVar28);
  mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar13._0_8_;
  mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar14._0_8_;
  Vnorm<double>((ChVector<double> *)local_458,(ChVector<double> *)&mrotma);
  auVar61 = _local_458;
  dVar35 = dStack_448;
  Get_shaft_dir2((ChVector<double> *)local_458,this);
  auVar17 = stack0xfffffffffffffbb0;
  auVar101._8_8_ = 0;
  auVar101._0_8_ = local_458._0_8_;
  auVar82._8_8_ = 0;
  auVar82._0_8_ = dStack_448;
  dVar102 = local_458._8_8_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar102 * -dVar34;
  auVar28 = vfmadd231sd_fma(auVar41,auVar28,auVar82);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = dStack_448 * -(double)uVar16;
  auVar13 = vfmadd231sd_fma(auVar83,local_528,auVar101);
  auVar65._8_8_ = 0;
  auVar65._0_8_ = (double)local_458._0_8_ * -dVar62;
  auVar14 = vfmadd231sd_fma(auVar65,auVar18,auVar17);
  mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar28._0_8_;
  mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar13._0_8_;
  mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar14._0_8_;
  Vnorm<double>((ChVector<double> *)local_458,(ChVector<double> *)&mrotma);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = local_458._0_8_;
  dVar1 = dStack_448;
  auVar84._8_8_ = dStack_448;
  auVar84._0_8_ = dStack_448;
  auVar28 = vshufpd_avx(auVar17,auVar101,1);
  auVar13 = vunpcklpd_avx(auVar84,auVar42);
  auVar66._0_8_ = local_458._8_8_ * auVar28._0_8_;
  auVar66._8_8_ = dVar1 * auVar28._8_8_;
  auVar28 = vfmsub213pd_fma(auVar13,auVar17,auVar66);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = (double)local_458._0_8_ * dVar102;
  auVar13 = vfmsub231sd_fma(auVar43,auVar101,stack0xfffffffffffffbb0);
  mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar28._0_8_;
  mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       auVar28._8_8_;
  mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       auVar13._0_8_;
  Vnorm<double>((ChVector<double> *)local_458,(ChVector<double> *)&mrotma);
  uVar25 = local_458._0_8_;
  uVar26 = local_458._8_8_;
  vrota.m_data[0] = 0.0;
  dVar1 = dStack_448;
  auVar60._8_8_ = dVar36;
  auVar60._0_8_ = dVar36;
  auVar60._16_8_ = dVar36;
  auVar60._24_8_ = dVar36;
  auVar31 = vinsertf64x4_avx512f(ZEXT3264(auVar60),auVar60,0);
  auVar32._0_16_ = local_308._0_16_;
  auVar32._16_8_ = auVar31._16_8_;
  auVar32._24_8_ = local_308._24_8_;
  auVar32._32_8_ = local_308._32_8_;
  auVar32._40_8_ = local_308._40_8_;
  auVar32._48_8_ = local_308._48_8_;
  auVar32._56_8_ = local_308._56_8_;
  auVar31 = vpermi2pd_avx512f(_DAT_00e7e840,auVar32,ZEXT1664(auVar18));
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar34;
  auVar32 = vbroadcastsd_avx512f(auVar13);
  auVar33._0_40_ = auVar31._0_40_;
  auVar33._40_8_ = auVar32._40_8_;
  auVar33._48_8_ = auVar31._48_8_;
  auVar33._56_8_ = auVar31._56_8_;
  _local_458 = vpermi2pd_avx512f(_DAT_00e7e880,auVar33,ZEXT1664(auVar61._0_16_));
  local_418 = dVar35;
  vrota.m_data[1] = this->beta;
  vrota.m_data[2] = 0.0;
  ChMatrix33<double>::Set_A_Rxyz(&mrotma,&vrota);
  ma2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_458;
  ma2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&mrotma;
  Eigen::PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,3,3,1,3,3>> *)&marot_beta,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>_>
              *)&ma2);
  vrota.m_data[0] = 0.0;
  vrota.m_data[1] = 0.0;
  auVar44._8_8_ = 0;
  auVar44._0_8_ = this->alpha;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.react_force.m_data[0];
  uVar16 = vcmpsd_avx512f(ZEXT816(0) << 0x40,auVar14,0xe);
  bVar12 = (bool)((byte)uVar16 & 1);
  auVar19._8_8_ = 0x8000000000000000;
  auVar19._0_8_ = 0x8000000000000000;
  auVar28 = vxorpd_avx512vl(auVar44,auVar19);
  vrota.m_data[2] = (double)((ulong)bVar12 * (long)this->alpha + (ulong)!bVar12 * auVar28._0_8_);
  ChMatrix33<double>::Set_A_Rxyz(&mrotma,&vrota);
  ma2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)&marot_beta;
  ma2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)&mrotma;
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Product<Eigen::Matrix<double,3,3,1,3,3>,Eigen::Matrix<double,3,3,1,3,3>,0>>
            ((Matrix<double,_3,_3,_1,_3,_3> *)local_458,
             (Product<Eigen::Matrix<double,_3,_3,_1,_3,_3>,_Eigen::Matrix<double,_3,_3,_1,_3,_3>,_0>
              *)&ma2);
  ma2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] = local_418
  ;
  ma2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       (double)local_458._0_8_;
  ma2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] =
       (double)local_458._8_8_;
  ma2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] =
       dStack_448;
  ma2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] =
       dStack_440;
  ma2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       dStack_438;
  ma2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] =
       dStack_430;
  ma2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[6] =
       dStack_428;
  ma2.super_Matrix<double,_3,_3,_1,_3,_3>.
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7] =
       dStack_420;
  Get_shaft_dir1((ChVector<double> *)&local_508,this);
  Get_shaft_dir2(&v,this);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = local_508.m_data[0];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = v.m_data[0];
  auVar67._8_8_ = 0;
  auVar67._0_8_ = local_508.m_data[1] * v.m_data[1];
  auVar28 = vfmadd231sd_fma(auVar67,auVar45,auVar17);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = local_508.m_data[2];
  auVar27._8_8_ = 0;
  auVar27._0_8_ = v.m_data[2];
  auVar28 = vfmadd132sd_fma(auVar46,auVar28,auVar27);
  dVar34 = acos(auVar28._0_8_);
  local_308._0_8_ = dVar34;
  Get_shaft_dir1((ChVector<double> *)&local_508,this);
  Get_shaft_dir2(&v,this);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = local_508.m_data[0];
  auVar2._8_8_ = 0;
  auVar2._0_8_ = v.m_data[0];
  auVar68._8_8_ = 0;
  auVar68._0_8_ = local_508.m_data[1] * v.m_data[1];
  auVar28 = vfmadd231sd_fma(auVar68,auVar47,auVar2);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = local_508.m_data[2];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = v.m_data[2];
  auVar28 = vfmadd132sd_fma(auVar48,auVar28,auVar3);
  auVar20._8_8_ = 0x7fffffffffffffff;
  auVar20._0_8_ = 0x7fffffffffffffff;
  auVar28 = vandpd_avx512vl(auVar28,auVar20);
  if (0.96 < auVar28._0_8_) {
    auVar70._8_8_ = 0;
    auVar70._0_8_ = local_4d8;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = result.m_data[0];
    auVar49._8_8_ = 0;
    auVar49._0_8_ = local_4e8 * result.m_data[1];
    auVar28 = vfmadd231sd_fma(auVar49,auVar70,auVar6);
    auVar71._8_8_ = 0;
    auVar71._0_8_ = local_4e0;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = result.m_data[2];
    auVar28 = vfmadd231sd_fma(auVar28,auVar71,auVar7);
    dVar34 = this->tau;
    dVar35 = auVar28._0_8_;
    if (this->epicyclic == false) {
      dVar36 = dVar35 / (1.0 / dVar34 + 1.0);
    }
    else {
      dVar36 = (dVar34 * dVar35) / (dVar34 + -1.0);
    }
    this->r2 = dVar35 - dVar36;
    dVar34 = dVar34 * (dVar35 - dVar36);
  }
  else {
    bVar12 = this->epicyclic;
    local_4a8._0_8_ = this->tau;
    local_4a8._8_8_ = 0;
    Get_shaft_dir2((ChVector<double> *)&local_508,this);
    auVar21._8_8_ = 0x8000000000000000;
    auVar21._0_8_ = 0x8000000000000000;
    auVar28 = vxorpd_avx512vl(local_4a8,auVar21);
    dVar34 = (double)local_308._0_8_ /
             ((double)((ulong)(bVar12 & 1) * auVar28._0_8_ +
                      (ulong)!(bool)(bVar12 & 1) * local_4a8._0_8_) + 1.0);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_508.m_data[0];
    auVar69._8_8_ = 0;
    auVar69._0_8_ = dVar62 * local_508.m_data[1];
    auVar28 = vfmadd231sd_fma(auVar69,auVar18,auVar4);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = local_508.m_data[2];
    auVar28 = vfmadd132sd_fma(local_528,auVar28,auVar5);
    dVar35 = acos(auVar28._0_8_);
    dVar35 = sin((dVar35 + -3.141592653589793 + 3.141592653589793) - (double)local_308._0_8_);
    dVar36 = sin((double)local_308._0_8_);
    dVar36 = local_4d0 / dVar36;
    dVar34 = tan(dVar34);
    dVar34 = dVar34 * dVar36 * dVar35;
    this->r2 = dVar34;
    dVar34 = dVar34 * this->tau;
  }
  this->r1 = dVar34;
  Get_shaft_pos2((ChVector<double> *)&local_508,this);
  dVar34 = this->r2;
  auVar50._0_8_ = dVar34 * (double)uVar25 + local_508.m_data[0];
  auVar50._8_8_ = dVar34 * (double)uVar26 + local_508.m_data[1];
  dVar34 = dVar34 * dVar1 + local_508.m_data[2];
  *(undefined1 (*) [16])(this->contact_pt).m_data = auVar50;
  (this->contact_pt).m_data[2] = dVar34;
  if (this->checkphase == true) {
    dVar35 = (-this->a2 /
              (double)((ulong)(this->epicyclic & 1) * (long)-this->tau +
                      (ulong)!(bool)(this->epicyclic & 1) * (long)this->tau) - this->a1) -
             this->phase;
    auVar51._8_8_ = 0;
    auVar51._0_8_ = dVar35;
    uVar16 = vcmpsd_avx512f(auVar51,ZEXT816(0x400921fb54442d18),0xe);
    bVar12 = (bool)((byte)uVar16 & 1);
    auVar30._0_8_ =
         (ulong)bVar12 * (long)(dVar35 + -6.283185307179586) + (ulong)!bVar12 * (long)dVar35;
    auVar30._8_8_ = 0;
    auVar28 = vminsd_avx(ZEXT816(0x3fe921fb54442d18),auVar30);
    uVar16 = vcmpsd_avx512f(auVar28,ZEXT816(0xbfe921fb54442d18),1);
    bVar12 = (bool)((byte)uVar16 & 1);
    vrota.m_data[2] =
         (double)((ulong)bVar12 * 0x3fe921fb54442d18 +
                 (ulong)!bVar12 * (auVar28._0_8_ ^ 0x8000000000000000));
    vrota.m_data[0] = 0.0;
    vrota.m_data[1] = 0.0;
    ChMatrix33<double>::Set_A_Rxyz(&mrotma,&vrota);
    local_310.m_matrix = &abs_shaft1.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>;
    Get_shaft_pos1((ChVector<double> *)local_1e8,this);
    v.m_data._0_16_ = vsubpd_avx(auVar50,local_1e8);
    v.m_data[2] = dVar34 - local_1d8;
    chrono::operator*(&local_310,&v);
    dVar1 = mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2];
    dVar36 = local_508.m_data[1];
    dVar35 = local_508.m_data[0];
    local_4d0 = local_508.m_data[2];
    local_4e8 = mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [0];
    local_320 = mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1];
    local_330 = mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
    local_340 = mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
    local_350 = mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [6];
    local_358 = mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
    local_308._0_8_ =
         mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
    local_4d8 = abs_shaft1.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [1];
    local_318 = abs_shaft1.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [3];
    local_328 = abs_shaft1.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [4];
    local_338 = abs_shaft1.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [6];
    local_348 = abs_shaft1.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [7];
    local_4e0 = abs_shaft1.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                [8];
    Get_shaft_pos1((ChVector<double> *)&local_508,this);
    auVar72._8_8_ = 0;
    auVar72._0_8_ = dVar35;
    auVar85._8_8_ = 0;
    auVar85._0_8_ = local_350;
    auVar99._8_8_ = 0;
    auVar99._0_8_ = local_330;
    auVar77._8_8_ = 0;
    auVar77._0_8_ = local_308._0_8_;
    auVar91._8_8_ = 0;
    auVar91._0_8_ = local_4d0;
    auVar52._8_8_ = 0;
    auVar52._0_8_ = dVar36 * local_358;
    auVar28 = vfmadd213sd_fma(auVar85,auVar72,auVar52);
    auVar28 = vfmadd213sd_fma(auVar77,auVar91,auVar28);
    auVar86._8_8_ = 0;
    auVar86._0_8_ =
         mrotma.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar53._8_8_ = 0;
    auVar53._0_8_ = dVar36 * local_340;
    auVar13 = vfmadd213sd_fma(auVar99,auVar72,auVar53);
    auVar96._8_8_ = 0;
    auVar96._0_8_ = local_4e8;
    auVar13 = vfmadd213sd_fma(auVar86,auVar91,auVar13);
    auVar100._8_8_ = 0;
    auVar100._0_8_ = local_318;
    auVar54._8_8_ = 0;
    auVar54._0_8_ = dVar36 * local_320;
    auVar14 = vfmadd213sd_fma(auVar96,auVar72,auVar54);
    auVar73._8_8_ = 0;
    auVar73._0_8_ = dVar1;
    dVar35 = auVar13._0_8_;
    auVar13 = vfmadd213sd_fma(auVar73,auVar91,auVar14);
    auVar92._8_8_ = 0;
    auVar92._0_8_ = local_338;
    auVar97._8_8_ = 0;
    auVar97._0_8_ = local_4e0;
    auVar55._8_8_ = 0;
    auVar55._0_8_ = dVar35 * local_348;
    auVar14 = vfmadd213sd_fma(auVar92,auVar13,auVar55);
    auVar14 = vfmadd213sd_fma(auVar97,auVar28,auVar14);
    auVar93._8_8_ = 0;
    auVar93._0_8_ =
         abs_shaft1.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
         super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5];
    auVar56._8_8_ = 0;
    auVar56._0_8_ = dVar35 * local_328;
    auVar17 = vfmadd213sd_fma(auVar100,auVar13,auVar56);
    auVar8._8_8_ = 0;
    auVar8._0_8_ = abs_shaft1.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[0];
    auVar57._8_8_ = 0;
    auVar57._0_8_ = dVar35 * local_4d8;
    auVar27 = vfmadd231sd_fma(auVar57,auVar13,auVar8);
    auVar13 = vfmadd213sd_fma(auVar93,auVar28,auVar17);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = abs_shaft1.Amatrix.super_Matrix<double,_3,_3,_1,_3,_3>.
                   super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                   array[2];
    auVar28 = vfmadd231sd_fma(auVar27,auVar28,auVar9);
    local_308._0_8_ = auVar28._0_8_ + local_508.m_data[0];
    local_498 = auVar13._0_8_ + local_508.m_data[1];
    dVar35 = auVar14._0_8_ + local_508.m_data[2];
  }
  else {
    auVar28 = vshufpd_avx(auVar50,auVar50,1);
    local_498 = auVar28._0_8_;
    local_308._0_8_ = auVar50._0_8_;
    dVar35 = dVar34;
  }
  Get_shaft_dir1((ChVector<double> *)&local_508,this);
  Get_shaft_pos1(&v,this);
  dVar62 = local_508.m_data[1];
  dVar36 = (this->contact_pt).m_data[1];
  dVar102 = v.m_data[0];
  dVar1 = (this->contact_pt).m_data[0];
  dVar24 = v.m_data[1];
  local_4e0 = (this->contact_pt).m_data[2];
  local_4e8 = v.m_data[2];
  local_4d0 = local_508.m_data[0];
  local_4d8 = local_508.m_data[2];
  Get_shaft_dir1((ChVector<double> *)&local_508,this);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_4d0;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = dVar1 - dVar102;
  auVar78._8_8_ = 0;
  auVar78._0_8_ = (dVar36 - dVar24) * dVar62;
  auVar28 = vfmadd231sd_fma(auVar78,auVar74,auVar10);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_4d8;
  auVar58._8_8_ = 0;
  auVar58._0_8_ = local_4e0 - local_4e8;
  auVar28 = vfmadd231sd_fma(auVar28,auVar58,auVar11);
  dVar36 = auVar28._0_8_;
  auVar59._8_8_ = dVar36;
  auVar59._0_8_ = dVar36;
  auVar22._8_8_ = 0x7fffffffffffffff;
  auVar22._0_8_ = 0x7fffffffffffffff;
  auVar28 = vandpd_avx512vl(auVar59,auVar22);
  v.m_data[2] = dVar36 * local_508.m_data[2];
  v.m_data[1] = dVar36 * local_508.m_data[1];
  v.m_data[0] = dVar36 * local_508.m_data[0];
  if (0.0001 < auVar28._0_8_) {
    ChFrame<double>::TransformDirectionParentToLocal
              ((ChVector<double> *)&local_508,
               (ChFrame<double> *)(this->super_ChLinkLock).super_ChLinkMarkers.super_ChLink.Body1,&v
              );
    dVar36 = (this->local_shaft1).coord.pos.m_data[2];
    dVar1 = (this->local_shaft1).coord.pos.m_data[1];
    (this->local_shaft1).coord.pos.m_data[0] =
         (this->local_shaft1).coord.pos.m_data[0] + local_508.m_data[0];
    (this->local_shaft1).coord.pos.m_data[1] = dVar1 + local_508.m_data[1];
    (this->local_shaft1).coord.pos.m_data[2] = dVar36 + local_508.m_data[2];
  }
  ((this->super_ChLinkLock).super_ChLinkMarkers.marker2)->motion_type = M_MOTION_EXTERNAL;
  ((this->super_ChLinkLock).super_ChLinkMarkers.marker1)->motion_type = M_MOTION_EXTERNAL;
  local_2c8.pos.m_data[0] = (double)local_308._0_8_;
  local_2c8.pos.m_data[1] = local_498;
  local_2c8.pos.m_data[2] = dVar35;
  ChMatrix33<double>::Get_A_quaternion(&local_508,(ChMatrix33<double> *)local_458);
  local_2c8.rot.m_data[0] = local_508.m_data[0];
  local_2c8.rot.m_data[1] = local_508.m_data[1];
  local_2c8.rot.m_data[2] = local_508.m_data[2];
  local_2c8.rot.m_data[3] = local_508.m_data[3];
  ChMarker::Impose_Abs_Coord((this->super_ChLinkLock).super_ChLinkMarkers.marker1,&local_2c8);
  local_2c8.pos.m_data[0] = auVar50._0_8_;
  local_2c8.pos.m_data[1] = auVar50._8_8_;
  local_2c8.pos.m_data[2] = dVar34;
  ChMatrix33<double>::Get_A_quaternion(&local_508,&ma2);
  local_2c8.rot.m_data[0] = local_508.m_data[0];
  local_2c8.rot.m_data[1] = local_508.m_data[1];
  local_2c8.rot.m_data[2] = local_508.m_data[2];
  local_2c8.rot.m_data[3] = local_508.m_data[3];
  ChMarker::Impose_Abs_Coord((this->super_ChLinkLock).super_ChLinkMarkers.marker2,&local_2c8);
  return;
}

Assistant:

void ChLinkGear::UpdateTime(double mytime) {
    // First, inherit to parent class
    ChLinkLock::UpdateTime(mytime);

    // Move markers 1 and 2 to align them as gear teeth

    ChVector<> mx;
    ChVector<> my;
    ChVector<> mz;
    ChVector<> mr;
    ChVector<> mmark1;
    ChVector<> mmark2;
    ChVector<> lastX;
    ChVector<> vrota;
    Coordsys newmarkpos;

    ChFrame<double> abs_shaft1;
    ChFrame<double> abs_shaft2;

    ((ChFrame<double>*)Body1)->TransformLocalToParent(local_shaft1, abs_shaft1);
    ((ChFrame<double>*)Body2)->TransformLocalToParent(local_shaft2, abs_shaft2);

    ChVector<> vbdist = Vsub(Get_shaft_pos1(), Get_shaft_pos2());
    ////ChVector<> Trad1 = Vnorm(Vcross(Get_shaft_dir1(), Vnorm(Vcross(Get_shaft_dir1(), vbdist))));
    ////ChVector<> Trad2 = Vnorm(Vcross(Vnorm(Vcross(Get_shaft_dir2(), vbdist)), Get_shaft_dir2()));

    double dist = Vlength(vbdist);

    // compute actual rotation of the two wheels (relative to truss).
    ChVector<> md1 = abs_shaft1.GetA().transpose() * (-vbdist);
    md1.z() = 0;
    md1 = Vnorm(md1);
    ChVector<> md2 = abs_shaft2.GetA().transpose() * (-vbdist);
    md2.z() = 0;
    md2 = Vnorm(md2);

    double periodic_a1 = ChAtan2(md1.x(), md1.y());
    double periodic_a2 = ChAtan2(md2.x(), md2.y());
    double old_a1 = a1;
    double old_a2 = a2;
    double turns_a1 = floor(old_a1 / CH_C_2PI);
    double turns_a2 = floor(old_a2 / CH_C_2PI);
    double a1U = turns_a1 * CH_C_2PI + periodic_a1 + CH_C_2PI;
    double a1M = turns_a1 * CH_C_2PI + periodic_a1;
    double a1L = turns_a1 * CH_C_2PI + periodic_a1 - CH_C_2PI;
    a1 = a1M;
    if (fabs(a1U - old_a1) < fabs(a1M - old_a1))
        a1 = a1U;
    if (fabs(a1L - a1) < fabs(a1M - a1))
        a1 = a1L;
    double a2U = turns_a2 * CH_C_2PI + periodic_a2 + CH_C_2PI;
    double a2M = turns_a2 * CH_C_2PI + periodic_a2;
    double a2L = turns_a2 * CH_C_2PI + periodic_a2 - CH_C_2PI;
    a2 = a2M;
    if (fabs(a2U - old_a2) < fabs(a2M - old_a2))
        a2 = a2U;
    if (fabs(a2L - a2) < fabs(a2M - a2))
        a2 = a2L;

    // compute new markers coordsystem alignment
    my = Vnorm(vbdist);
    mz = Get_shaft_dir1();
    mx = Vnorm(Vcross(my, mz));
    mr = Vnorm(Vcross(mz, mx));
    mz = Vnorm(Vcross(mx, my));
    ChVector<> mz2, mx2, mr2, my2;
    my2 = my;
    mz2 = Get_shaft_dir2();
    mx2 = Vnorm(Vcross(my2, mz2));
    mr2 = Vnorm(Vcross(mz2, mx2));

    ChMatrix33<> ma1(mx, my, mz);

    // rotate csys because of beta
    vrota.x() = 0.0;
    vrota.y() = beta;
    vrota.z() = 0.0;
    ChMatrix33<> mrotma;
    mrotma.Set_A_Rxyz(vrota);
    ChMatrix33<> marot_beta = ma1 * mrotma;
    // rotate csys because of alpha
    vrota.x() = 0.0;
    vrota.y() = 0.0;
    vrota.z() = alpha;
    if (react_force.x() < 0)
        vrota.z() = alpha;
    else
        vrota.z() = -alpha;
    mrotma.Set_A_Rxyz(vrota);
    ma1 = marot_beta * mrotma;

    ChMatrix33<> ma2 = ma1;

    // is a bevel gear?
    double be = acos(Vdot(Get_shaft_dir1(), Get_shaft_dir2()));
    bool is_bevel = true;
    if (fabs(Vdot(Get_shaft_dir1(), Get_shaft_dir2())) > 0.96)
        is_bevel = false;

    // compute wheel radii so that:
    //            w2 = - tau * w1
    if (!is_bevel) {
        double pardist = Vdot(mr, vbdist);
        double inv_tau = 1.0 / tau;
        if (!epicyclic) {
            r2 = pardist - pardist / (inv_tau + 1.0);
        } else {
            r2 = pardist - (tau * pardist) / (tau - 1.0);
        }
        r1 = r2 * tau;
    } else {
        double gamma2;
        if (!epicyclic) {
            gamma2 = be / (tau + 1.0);
        } else {
            gamma2 = be / (-tau + 1.0);
        }
        double al = CH_C_PI - acos(Vdot(Get_shaft_dir2(), my));
        double te = CH_C_PI - al - be;
        double fd = sin(te) * (dist / sin(be));
        r2 = fd * tan(gamma2);
        r1 = r2 * tau;
    }

    // compute markers positions, supposing they
    // stay on the ideal wheel contact point
    mmark1 = Vadd(Get_shaft_pos2(), Vmul(mr2, r2));
    mmark2 = mmark1;
    contact_pt = mmark1;

    // correct marker 1 position if phasing is not correct
    if (checkphase) {
        double realtau = tau;
        if (epicyclic)
            realtau = -tau;
        double m_delta;
        m_delta = -(a2 / realtau) - a1 - phase;

        if (m_delta > CH_C_PI)
            m_delta -= (CH_C_2PI);  // range -180..+180 is better than 0...360
        if (m_delta > (CH_C_PI / 4.0))
            m_delta = (CH_C_PI / 4.0);  // phase correction only in +/- 45�
        if (m_delta < -(CH_C_PI / 4.0))
            m_delta = -(CH_C_PI / 4.0);

        vrota.x() = vrota.y() = 0.0;
        vrota.z() = -m_delta;
        mrotma.Set_A_Rxyz(vrota);  // rotate about Z of shaft to correct
        mmark1 = abs_shaft1.GetA().transpose() * (mmark1 - Get_shaft_pos1());
        mmark1 = mrotma * mmark1;
        mmark1 = abs_shaft1.GetA() * mmark1 + Get_shaft_pos1();
    }
    // Move Shaft 1 along its direction if not aligned to wheel
    double offset = Vdot(Get_shaft_dir1(), (contact_pt - Get_shaft_pos1()));
    ChVector<> moff = Get_shaft_dir1() * offset;
    if (fabs(offset) > 0.0001)
        local_shaft1.SetPos(local_shaft1.GetPos() + Body1->TransformDirectionParentToLocal(moff));

    // ! Require that the BDF routine of marker won't handle speed and acc.calculus of the moved marker 2!
    marker2->SetMotionType(ChMarker::M_MOTION_EXTERNAL);
    marker1->SetMotionType(ChMarker::M_MOTION_EXTERNAL);

    // move marker1 in proper positions
    newmarkpos.pos = mmark1;
    newmarkpos.rot = ma1.Get_A_quaternion();
    marker1->Impose_Abs_Coord(newmarkpos);  // move marker1 into teeth position
    // move marker2 in proper positions
    newmarkpos.pos = mmark2;
    newmarkpos.rot = ma2.Get_A_quaternion();
    marker2->Impose_Abs_Coord(newmarkpos);  // move marker2 into teeth position
}